

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorStraightGradient::RenderElement
          (DecoratorStraightGradient *this,Element *element,DecoratorDataHandle element_data)

{
  Texture texture;
  CompiledShader local_58;
  Texture local_48;
  Vector2f local_30;
  DecoratorDataHandle local_28;
  Geometry *data;
  DecoratorDataHandle element_data_local;
  Element *element_local;
  DecoratorStraightGradient *this_local;
  
  local_28 = element_data;
  data = (Geometry *)element_data;
  element_data_local = (DecoratorDataHandle)element;
  element_local = (Element *)this;
  local_30 = Element::GetAbsoluteOffset(element,Border);
  local_48.render_manager = (RenderManager *)0x0;
  local_48.file_index = ~Invalid;
  local_48.callback_index = ~Invalid;
  Texture::Texture(&local_48);
  local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)0x0;
  local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0;
  CompiledShader::CompiledShader(&local_58);
  texture.file_index = local_48.file_index;
  texture.callback_index = local_48.callback_index;
  texture.render_manager = local_48.render_manager;
  Geometry::Render((Geometry *)element_data,local_30,texture,&local_58);
  CompiledShader::~CompiledShader(&local_58);
  return;
}

Assistant:

void DecoratorStraightGradient::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	auto* data = reinterpret_cast<Geometry*>(element_data);
	data->Render(element->GetAbsoluteOffset(BoxArea::Border));
}